

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fill_system_smooth.c
# Opt level: O1

void fill_system(Sparse_matrix *lh_side,double *rh_side,Grid *grid,Node_status *node_status,
                Gas_parameters *gas_parameters,double *space_coordinates,uint time_step,double *G,
                double *V)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double value;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint row;
  ulong uVar10;
  uint row_00;
  long lVar11;
  double value_00;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double value_01;
  double value_02;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  value = 1.0 / grid->X_step;
  value_00 = 1.0 / grid->T_step;
  dVar13 = gas_parameters->viscosity;
  dVar12 = function_norm_C(G,grid->X_nodes,exp_1);
  Sparse_matrix_Clear(lh_side);
  uVar7 = (ulong)grid->X_nodes;
  if (grid->X_nodes != 0) {
    value_01 = value * 0.5;
    dVar19 = value / 6.0;
    dVar17 = value * 0.25;
    dVar20 = (value * value * 4.0) / 3.0;
    dVar13 = dVar13 * dVar12;
    dVar21 = dVar20 * dVar13;
    value_02 = -value_01;
    dVar18 = -dVar17;
    dVar12 = (double)time_step;
    lVar11 = 0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      iVar5 = *(int *)((long)node_status + lVar11 * 2);
      row = (uint)uVar9;
      if (iVar5 == 2) {
        Sparse_matrix_Append_element(lh_side,row,(int)uVar7 * 2 - 4,V[(int)uVar7 - 2] * value_02);
        Sparse_matrix_Append_element(lh_side,row,grid->X_nodes * 2 - 3,-value);
        Sparse_matrix_Append_element
                  (lh_side,row,grid->X_nodes * 2 - 2,V[grid->X_nodes - 1] * value_01 + value_00);
        Sparse_matrix_Append_element(lh_side,row,grid->X_nodes * 2 - 1,value);
        uVar8 = grid->X_nodes;
        dVar1 = G[uVar8 - 1];
        dVar2 = V[uVar8 - 1];
        dVar3 = V[uVar8 - 2];
        dVar15 = G[uVar8 - 2];
        dVar4 = V[uVar8 - 3];
        dVar16 = G[uVar8 - 3];
        dVar14 = rhs_1st_equation(*(double *)((long)space_coordinates + lVar11 * 4),
                                  grid->T_step * dVar12,gas_parameters);
        rh_side[uVar9] =
             dVar14 + (((dVar2 - (dVar3 + dVar3)) + dVar4) * (2.0 - dVar1) +
                      dVar16 * dVar4 + dVar1 * dVar2 + dVar15 * -2.0 * dVar3) * dVar18 +
                      value_00 * dVar1 + (dVar2 - dVar3) * value_01 * dVar1;
        uVar8 = grid->X_nodes * 2 - 1;
LAB_00105986:
        Sparse_matrix_Append_element(lh_side,row + 1,uVar8,1.0);
        dVar14 = 0.0;
LAB_00105997:
        rh_side[row + 1] = dVar14;
        uVar9 = (ulong)(row + 2);
      }
      else {
        if (iVar5 == 1) {
          uVar6 = (int)uVar10 - 1;
          uVar8 = (uint)lVar11;
          Sparse_matrix_Append_element
                    (lh_side,row,uVar8 - 2,
                     *(double *)((long)V + lVar11 * 4) * dVar18 + V[uVar6] * dVar18);
          Sparse_matrix_Append_element(lh_side,row,uVar8 - 1,value_02);
          Sparse_matrix_Append_element(lh_side,row,uVar8,value_00);
          Sparse_matrix_Append_element
                    (lh_side,row,uVar8 + 2,
                     *(double *)((long)V + lVar11 * 4) * dVar17 +
                     *(double *)((long)V + lVar11 * 4 + 8) * dVar17);
          Sparse_matrix_Append_element(lh_side,row,uVar8 + 3,value_01);
          dVar1 = *(double *)((long)G + lVar11 * 4);
          dVar2 = *(double *)((long)V + lVar11 * 4 + 8);
          dVar3 = V[uVar6];
          dVar15 = rhs_1st_equation(*(double *)((long)space_coordinates + lVar11 * 4),
                                    grid->T_step * dVar12,gas_parameters);
          rh_side[uVar9] = dVar15 + dVar1 * value_00 + (dVar2 - dVar3) * dVar17 * dVar1;
          row_00 = row + 1;
          Sparse_matrix_Append_element(lh_side,row_00,uVar8 - 2,gas_parameters->p_ro * value_02);
          Sparse_matrix_Append_element
                    (lh_side,row_00,uVar8 - 1,
                     (*(double *)((long)V + lVar11 * 4) * -dVar19 + V[uVar6] * -dVar19) - dVar21);
          Sparse_matrix_Append_element(lh_side,row_00,uVar8 + 1,dVar21 + dVar21 + value_00);
          Sparse_matrix_Append_element(lh_side,row_00,uVar8 + 2,gas_parameters->p_ro * value_01);
          Sparse_matrix_Append_element
                    (lh_side,row_00,uVar8 + 3,
                     (*(double *)((long)V + lVar11 * 4) * dVar19 +
                     *(double *)((long)V + lVar11 * 4 + 8) * dVar19) - dVar21);
          dVar1 = gas_parameters->viscosity;
          dVar2 = *(double *)((long)V + lVar11 * 4);
          dVar16 = exp_1(*(double *)((long)G + lVar11 * 4));
          dVar3 = V[uVar6];
          dVar15 = *(double *)((long)V + lVar11 * 4);
          dVar4 = *(double *)((long)V + lVar11 * 4 + 8);
          dVar14 = rhs_2nd_equation(*(double *)((long)space_coordinates + lVar11 * 4),
                                    grid->T_step * dVar12,gas_parameters);
          dVar14 = dVar14 + (dVar13 - dVar16 * dVar1) * -dVar20 *
                            ((dVar3 - (dVar15 + dVar15)) + dVar4) + dVar2 * value_00;
          goto LAB_00105997;
        }
        if (iVar5 == 0) {
          Sparse_matrix_Append_element(lh_side,row,0,*V * value_02 + value_00);
          Sparse_matrix_Append_element(lh_side,row,1,-value);
          Sparse_matrix_Append_element(lh_side,row,2,V[1] * value_01);
          Sparse_matrix_Append_element(lh_side,row,3,value);
          dVar1 = *G;
          dVar2 = *V;
          dVar3 = V[1];
          dVar15 = V[2];
          dVar4 = G[1];
          dVar16 = G[2];
          dVar14 = rhs_1st_equation(*(double *)((long)space_coordinates + lVar11 * 4),
                                    grid->T_step * dVar12,gas_parameters);
          rh_side[uVar9] =
               dVar14 + (((dVar15 - (dVar3 + dVar3)) + dVar2) * (2.0 - dVar1) +
                        dVar1 * dVar2 + dVar16 * dVar15 + dVar4 * -2.0 * dVar3) * dVar17 +
                        value_00 * dVar1 + (dVar3 - dVar2) * value_01 * dVar1;
          uVar8 = 1;
          goto LAB_00105986;
        }
      }
      uVar10 = uVar10 + 1;
      uVar7 = (ulong)grid->X_nodes;
      lVar11 = lVar11 + 2;
    } while (uVar10 < uVar7);
  }
  Sparse_matrix_Finish_filling(lh_side);
  return;
}

Assistant:

void fill_system (
    Sparse_matrix * lh_side,
    double * rh_side,
    Grid const * grid,
    Node_status const * node_status,
    Gas_parameters const * gas_parameters,
    double const * space_coordinates,
    unsigned const time_step,
    double const * G,
    double const * V) {

  unsigned space_step = 0,
  // iterator through rows
           row_number = 0;

  // auxiliary constants
  double const rev_h   = 1. / grid->X_step,
         rev_h_2 = .5 * rev_h,
         rev_h_4 = .25 * rev_h,
         rev_h_6 = rev_h / 6.,
         rev_hh_4_3 = rev_h * rev_h * 4. / 3.,

         rev_tau = 1. / grid->T_step;

  double const viscosity_norm =
    gas_parameters->viscosity * function_norm_C (G, grid->X_nodes, exp_1);

  double const mu_tilda_rev_hh_4_3 = viscosity_norm * rev_hh_4_3;

  Sparse_matrix_Clear (lh_side);

  for (space_step = 0; space_step < grid->X_nodes; ++space_step) {
    switch (node_status[space_step]) {
      case LEFT:
        MATRIX_APPEND (G_INDEX(0), rev_tau - rev_h_2 * V[0]);
        MATRIX_APPEND (V_INDEX(0), -rev_h);
        MATRIX_APPEND (G_INDEX(1), rev_h_2 * V[1]);
        MATRIX_APPEND (V_INDEX(1), rev_h);

        rh_side[row_number] = rev_tau * G[0] +
                   rev_h_2 * G[0] * (V[1] - V[0]) +
                   rev_h_4 *
                     (G[2] * V[2] - 2 * G[1] * V[1] + G[0] * V[0] +
                       (2 - G[0]) * (V[2] - 2 * V[1] + V[0])) +
                   rhs_1st_equation (space_coordinates[space_step], time_step * grid->T_step, gas_parameters);
        ++row_number;

        /* dummy equation */

        MATRIX_APPEND (V_INDEX(0), 1);
        rh_side[row_number] = 0;
        ++row_number;
        break;

      case MIDDLE:
        MATRIX_APPEND (G_INDEX(space_step - 1), -rev_h_4 * V[space_step] - rev_h_4 * V[space_step - 1]);
        MATRIX_APPEND (V_INDEX(space_step - 1), -rev_h_2);
        MATRIX_APPEND (G_INDEX(space_step), rev_tau);
        MATRIX_APPEND (G_INDEX(space_step + 1), rev_h_4 * V[space_step] + rev_h_4 * V[space_step + 1]);
        MATRIX_APPEND (V_INDEX(space_step + 1), rev_h_2);

        rh_side[row_number] = rev_tau * G[space_step] +
                   rev_h_4 * G[space_step] * (V[space_step + 1] - V[space_step - 1]) +
                   rhs_1st_equation (space_coordinates[space_step], time_step * grid->T_step, gas_parameters);
        ++row_number;
        /* another equation */
        /* attention: these values should be changed when (viscosity != 0) */
        MATRIX_APPEND (G_INDEX(space_step - 1), -rev_h_2 * gas_parameters->p_ro);
        // change me!
        MATRIX_APPEND (V_INDEX(space_step - 1), -rev_h_6 * V[space_step] - rev_h_6 * V[space_step - 1] - mu_tilda_rev_hh_4_3);
        // change me!
        MATRIX_APPEND (V_INDEX(space_step), rev_tau + 2 * mu_tilda_rev_hh_4_3);
        MATRIX_APPEND (G_INDEX(space_step + 1), rev_h_2 * gas_parameters->p_ro);
        // change me!
        MATRIX_APPEND (V_INDEX(space_step + 1), rev_h_6 * V[space_step] + rev_h_6 * V[space_step + 1] - mu_tilda_rev_hh_4_3);
        // change me!
        rh_side[row_number] = rev_tau * V[space_step] -
                  rev_hh_4_3 *
                    (viscosity_norm - gas_parameters->viscosity * exp_1 (G[space_step])) *
                    (V[space_step - 1] - 2 * V[space_step] + V[space_step + 1]) +
                  rhs_2nd_equation (space_coordinates[space_step], time_step * grid->T_step, gas_parameters);
        ++row_number;
        break;

      case RIGHT:
        MATRIX_APPEND (G_INDEX(grid->X_nodes - 2), -rev_h_2 * V[grid->X_nodes - 2]);
        MATRIX_APPEND (V_INDEX(grid->X_nodes - 2), -rev_h);
        MATRIX_APPEND (G_INDEX(grid->X_nodes - 1), rev_tau + rev_h_2 * V[grid->X_nodes - 1]);
        MATRIX_APPEND (V_INDEX(grid->X_nodes - 1), rev_h);

        rh_side[row_number] = rev_tau * G[grid->X_nodes - 1] +
                   rev_h_2 * G[grid->X_nodes - 1] * (V[grid->X_nodes - 1] - V[grid->X_nodes - 2]) -
                   rev_h_4 *
                     (G[grid->X_nodes - 1] * V[grid->X_nodes - 1] -
                      2 * G[grid->X_nodes - 2] * V[grid->X_nodes - 2] +
                      G[grid->X_nodes - 3] * V[grid->X_nodes - 3] +
                        (2 - G[grid->X_nodes - 1]) *
                        (V[grid->X_nodes - 1] - 2 * V[grid->X_nodes - 2] + V[grid->X_nodes - 3])) +
                   rhs_1st_equation(space_coordinates[space_step], time_step * grid->T_step, gas_parameters);
        ++row_number;

        /* dummy equation */

        MATRIX_APPEND (V_INDEX(grid->X_nodes - 1), 1);
        rh_side[row_number] = 0;
        ++row_number;
        break;

      default:
        break;
    }
  }

  Sparse_matrix_Finish_filling (lh_side);
  return;
}